

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-rinex.c
# Opt level: O3

int coda_rinex_close(coda_product *product)

{
  if (product->root_type != (coda_dynamic_type *)0x0) {
    coda_dynamic_type_delete(product->root_type);
  }
  if (product->filename != (char *)0x0) {
    free(product->filename);
  }
  free(product);
  return 0;
}

Assistant:

int coda_rinex_close(coda_product *product)
{
    if (product->root_type != NULL)
    {
        coda_dynamic_type_delete(product->root_type);
    }

    if (product->filename != NULL)
    {
        free(product->filename);
    }

    free(product);

    return 0;
}